

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_egads.c
# Opt level: O0

REF_STATUS
ref_egads_feature_size
          (REF_GRID ref_grid,REF_INT node,REF_DBL *h0,REF_DBL *dir0,REF_DBL *h1,REF_DBL *dir1,
          REF_DBL *h2,REF_DBL *dir2)

{
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_GEOM ref_geom;
  REF_DBL *dir1_local;
  REF_DBL *h1_local;
  REF_DBL *dir0_local;
  REF_DBL *h0_local;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  
  ref_grid_local._4_4_ = ref_egads_diagonal(ref_grid->geom,-1,h0);
  if (ref_grid_local._4_4_ == 0) {
    *dir0 = 1.0;
    dir0[1] = 0.0;
    dir0[2] = 0.0;
    *h1 = *h0;
    *h2 = *h0;
    ref_grid_local._4_4_ = ref_math_orthonormal_system(dir0,dir1,dir2);
    if (ref_grid_local._4_4_ == 0) {
      ref_grid_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",0xfac
             ,"ref_egads_feature_size",(ulong)ref_grid_local._4_4_,"arbitrary orthonormal dir1 dir2"
            );
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",0xfa5,
           "ref_egads_feature_size",(ulong)ref_grid_local._4_4_,"bbox diag init");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_egads_feature_size(REF_GRID ref_grid, REF_INT node,
                                          REF_DBL *h0, REF_DBL *dir0,
                                          REF_DBL *h1, REF_DBL *dir1,
                                          REF_DBL *h2, REF_DBL *dir2) {
#ifdef HAVE_EGADS
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT edge_item, face_item, edge_geom, face_geom, edgeid, faceid, iloop;
  ego ref, *cadnodes, *edges, *loops;
  int oclass, mtype, ncadnode, nedge, nloop, *senses;
  double data[18];
  double trange[2];
  REF_DBL xyz[3];
  REF_DBL dxyz_dt[6];
  REF_DBL xyz1[3];
  REF_INT ineligible_cad_node0, ineligible_cad_node1;
  REF_INT cad_node0, cad_node1;
  REF_DBL param[2];
  REF_INT other_edgeid, iedge;
  REF_DBL len, diagonal, hmax;
  REF_DBL tangent[3], dx[3], dot, orth[3];
  REF_DBL gap;
  int status;

  /* initialize isotropic with bounding box */
  RSS(ref_egads_diagonal(ref_geom, REF_EMPTY, &diagonal), "bbox diag init");
  hmax = diagonal;
  hmax /= MAX(1.0, ref_geom_segments_per_bounding_box_diagonal(ref_geom));
  *h0 = hmax;
  dir0[0] = 1.0;
  dir0[1] = 0.0;
  dir0[2] = 0.0;
  *h1 = hmax;
  dir1[0] = 0.0;
  dir1[1] = 1.0;
  dir1[2] = 0.0;
  *h2 = hmax;
  dir2[0] = 0.0;
  dir2[1] = 0.0;
  dir2[2] = 1.0;

  each_ref_geom_having_node(ref_geom, node, edge_item, edge_geom) {
    if (REF_GEOM_EDGE == ref_geom_type(ref_geom, edge_geom)) {
      edgeid = ref_geom_id(ref_geom, edge_geom);
      REIS(EGADS_SUCCESS,
           EG_getTopology(((ego *)(ref_geom->edges))[edgeid - 1], &ref, &oclass,
                          &mtype, trange, &ncadnode, &cadnodes, &senses),
           "EG topo edge");
      RAS(mtype != DEGENERATE, "edge interior DEGENERATE");
      RSS(ref_egads_eval(ref_geom, edge_geom, xyz, dxyz_dt), "eval edge");
      tangent[0] = dxyz_dt[0];
      tangent[1] = dxyz_dt[1];
      tangent[2] = dxyz_dt[2];
      if (REF_SUCCESS != ref_math_normalize(tangent)) {
        tangent[0] = 0.0;
        tangent[1] = 0.0;
        tangent[2] = 0.0;
      }
      RAS(0 < ncadnode && ncadnode < 3, "edge children");
      ineligible_cad_node0 =
          EG_indexBodyTopo((ego)(ref_geom->body), cadnodes[0]);
      if (2 == ncadnode) {
        ineligible_cad_node1 =
            EG_indexBodyTopo((ego)(ref_geom->body), cadnodes[1]);
      } else {
        ineligible_cad_node1 = ineligible_cad_node0; /* ONENODE edge */
      }
      each_ref_geom_having_node(ref_geom, node, face_item, face_geom) {
        if (REF_GEOM_FACE == ref_geom_type(ref_geom, face_geom)) {
          faceid = ref_geom_id(ref_geom, face_geom);
          REIS(EGADS_SUCCESS,
               EG_getTopology(((ego *)(ref_geom->faces))[faceid - 1], &ref,
                              &oclass, &mtype, data, &nloop, &loops, &senses),
               "topo");
          for (iloop = 0; iloop < nloop; iloop++) {
            /* loop through all Edges associated with this Loop */
            REIS(EGADS_SUCCESS,
                 EG_getTopology(loops[iloop], &ref, &oclass, &mtype, data,
                                &nedge, &edges, &senses),
                 "topo");
            for (iedge = 0; iedge < nedge; iedge++) {
              other_edgeid =
                  EG_indexBodyTopo((ego)(ref_geom->body), edges[iedge]);
              /* qualified? does not share geom nodes */
              REIS(EGADS_SUCCESS,
                   EG_getTopology(((ego *)(ref_geom->edges))[other_edgeid - 1],
                                  &ref, &oclass, &mtype, trange, &ncadnode,
                                  &cadnodes, &senses),
                   "EG topo node");
              if (mtype == DEGENERATE) continue; /* skip DEGENERATE */
              RAS(0 < ncadnode && ncadnode < 3, "edge children");
              cad_node0 = EG_indexBodyTopo((ego)(ref_geom->body), cadnodes[0]);
              if (2 == ncadnode) {
                cad_node1 =
                    EG_indexBodyTopo((ego)(ref_geom->body), cadnodes[1]);
              } else {
                cad_node1 = cad_node0; /* ONENODE edge */
              }
              if (cad_node0 == ineligible_cad_node0 ||
                  cad_node0 == ineligible_cad_node1 ||
                  cad_node1 == ineligible_cad_node0 ||
                  cad_node1 == ineligible_cad_node1)
                continue;
              /* inverse projection */
              status =
                  EG_invEvaluate(((ego *)(ref_geom->edges))[other_edgeid - 1],
                                 xyz, param, xyz1);
              REIS(EGADS_SUCCESS, status, "EG_invEvaluate opp edge");
              dx[0] = xyz1[0] - xyz[0];
              dx[1] = xyz1[1] - xyz[1];
              dx[2] = xyz1[2] - xyz[2];
              len = sqrt(dx[0] * dx[0] + dx[1] * dx[1] + dx[2] * dx[2]);
              RSS(ref_egads_gap(ref_geom, node, &gap), "edge gap");
              len = MAX(len, gap);
              RSS(ref_math_normalize(dx), "direction across face");
              if (len < *h0) {
                dot = ref_math_dot(tangent, dx);
                orth[0] = tangent[0] - dot * dx[0];
                orth[1] = tangent[1] - dot * dx[1];
                orth[2] = tangent[2] - dot * dx[2];
                if (REF_SUCCESS == ref_math_normalize(orth)) {
                  *h0 = len;
                  dir0[0] = dx[0];
                  dir0[1] = dx[1];
                  dir0[2] = dx[2];
                  RSS(ref_egads_diagonal(ref_geom, edge_geom, h1),
                      "local diag");
                  dir1[0] = orth[0];
                  dir1[1] = orth[1];
                  dir1[2] = orth[2];
                  *h2 = diagonal;
                  ref_math_cross_product(dir0, dir1, dir2);
                } else {
                  *h0 = len;
                  dir0[0] = dx[0];
                  dir0[1] = dx[1];
                  dir0[2] = dx[2];
                  *h1 = diagonal;
                  *h2 = diagonal;
                  RSS(ref_math_orthonormal_system(dir0, dir1, dir2),
                      "arbitrary orthonormal dir1 dir2");
                }
              }
            }
          }
        }
      }
    }
  }
#else
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  RSS(ref_egads_diagonal(ref_geom, REF_EMPTY, h0), "bbox diag init");
  dir0[0] = 1.0;
  dir0[1] = 0.0;
  dir0[2] = 0.0;
  *h1 = *h0;
  *h2 = *h0;
  RSS(ref_math_orthonormal_system(dir0, dir1, dir2),
      "arbitrary orthonormal dir1 dir2");
  SUPRESS_UNUSED_COMPILER_WARNING(node);
#endif
  return REF_SUCCESS;
}